

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void disas_simd_copy(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *pTVar1;
  _Bool _Var2;
  uint32_t uVar3;
  uint32_t element;
  TCGv_i64 pTVar4;
  uint destidx;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  MemOp MVar8;
  uint srcidx;
  uint value;
  uintptr_t o;
  
  destidx = insn & 0x1f;
  srcidx = insn >> 5 & 0x1f;
  uVar5 = insn >> 0xb & 0xf;
  uVar7 = insn >> 0x1e;
  value = insn >> 0x10 & 0x1f;
  bVar6 = (byte)(insn >> 0x1e);
  if ((insn >> 0x1d & 1) != 0) {
    if ((uVar7 & 1) != 0) {
      if (value == 0) {
        MVar8 = MO_ALIGN_4;
      }
      else {
        MVar8 = MO_8;
        if (value != 0) {
          for (; (value >> MVar8 & 1) == 0; MVar8 = MVar8 + MO_16) {
          }
        }
      }
      if (MVar8 < MO_ASHIFT) {
        pTVar1 = s->uc->tcg_ctx;
        _Var2 = fp_access_check(s);
        if (!_Var2) {
          return;
        }
        uVar3 = extract32(value,MVar8 + MO_16,5);
        element = extract32(uVar5,MVar8,4);
        pTVar4 = tcg_temp_new_i64(pTVar1);
        read_vec_element(s,pTVar4,srcidx,element,MVar8);
        write_vec_element(s,pTVar4,destidx,uVar3,MVar8);
        tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(pTVar4 + (long)pTVar1));
LAB_00636986:
        clear_vec_high(s,true,destidx);
        return;
      }
    }
    goto switchD_006368b9_caseD_2;
  }
  switch(uVar5) {
  case 0:
    if (value == 0) {
      uVar5 = 0x20;
    }
    else {
      uVar5 = 0;
      if (value != 0) {
        for (; (value >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
    }
    if ((3 < uVar5) || (uVar5 == 3 && (uVar7 & 1) == 0)) goto switchD_006368b9_caseD_2;
    pTVar1 = s->uc->tcg_ctx;
    _Var2 = fp_access_check(s);
    if (_Var2) {
      tcg_gen_gvec_dup_mem_aarch64
                (pTVar1,uVar5,destidx * 0x100 + 0xc10,
                 srcidx * 0x100 + 0xc10 +
                 ((value >> ((byte)uVar5 + 1 & 0x1f)) << ((byte)uVar5 & 0x1f)),(uVar7 & 1) * 8 + 8,
                 s->sve_len);
      return;
    }
    break;
  case 1:
    if (value == 0) {
      uVar5 = 0x20;
    }
    else {
      uVar5 = 0;
      if (value != 0) {
        for (; (value >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
    }
    if ((3 < uVar5) || (uVar5 == 3 && (uVar7 & 1) == 0)) goto switchD_006368b9_caseD_2;
    pTVar1 = s->uc->tcg_ctx;
    _Var2 = fp_access_check(s);
    if (_Var2) {
      uVar3 = s->sve_len;
      pTVar4 = cpu_reg_aarch64(s,srcidx);
      tcg_gen_gvec_dup_i64_aarch64
                (pTVar1,uVar5,destidx * 0x100 + 0xc10,(uVar7 & 1) * 8 + 8,uVar3,pTVar4);
      return;
    }
    break;
  case 3:
    if ((uVar7 & 1) != 0) {
      if (value == 0) {
        MVar8 = MO_ALIGN_4;
      }
      else {
        MVar8 = MO_8;
        if (value != 0) {
          for (; (value >> MVar8 & 1) == 0; MVar8 = MVar8 + MO_16) {
          }
        }
      }
      if (MVar8 < MO_ASHIFT) {
        _Var2 = fp_access_check(s);
        if (!_Var2) {
          return;
        }
        uVar3 = extract32(value,MVar8 + MO_16,4 - MVar8);
        pTVar4 = cpu_reg_aarch64(s,srcidx);
        write_vec_element(s,pTVar4,destidx,uVar3,MVar8);
        goto LAB_00636986;
      }
    }
  default:
switchD_006368b9_caseD_2:
    unallocated_encoding_aarch64(s);
    return;
  case 5:
  case 7:
    if (value == 0) {
      MVar8 = MO_ALIGN_4;
    }
    else {
      MVar8 = MO_8;
      if (value != 0) {
        for (; (value >> MVar8 & 1) == 0; MVar8 = MVar8 + MO_16) {
        }
      }
    }
    pTVar1 = s->uc->tcg_ctx;
    if (uVar5 == 5) {
      if ((MO_32 < MVar8) || ((uVar7 & 1) == 0 && MVar8 == MO_32)) goto switchD_006368b9_caseD_2;
    }
    else if ((MO_64 < MVar8) || (((MVar8 != MO_64 ^ bVar6) & 1) == 0))
    goto switchD_006368b9_caseD_2;
    _Var2 = fp_access_check(s);
    if (_Var2) {
      uVar3 = extract32(value,MVar8 + MO_16,4);
      pTVar4 = cpu_reg_aarch64(s,destidx);
      read_vec_element(s,pTVar4,srcidx,uVar3,(uint)(uVar5 == 5) << 2 | MVar8);
      if ((bVar6 & 1) == 0 && uVar5 == 5) {
        tcg_gen_ext32u_i64_aarch64(pTVar1,pTVar4,pTVar4);
        return;
      }
    }
  }
  return;
}

Assistant:

static void disas_simd_copy(DisasContext *s, uint32_t insn)
{
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int imm4 = extract32(insn, 11, 4);
    int op = extract32(insn, 29, 1);
    int is_q = extract32(insn, 30, 1);
    int imm5 = extract32(insn, 16, 5);

    if (op) {
        if (is_q) {
            /* INS (element) */
            handle_simd_inse(s, rd, rn, imm4, imm5);
        } else {
            unallocated_encoding(s);
        }
    } else {
        switch (imm4) {
        case 0:
            /* DUP (element - vector) */
            handle_simd_dupe(s, is_q, rd, rn, imm5);
            break;
        case 1:
            /* DUP (general) */
            handle_simd_dupg(s, is_q, rd, rn, imm5);
            break;
        case 3:
            if (is_q) {
                /* INS (general) */
                handle_simd_insg(s, rd, rn, imm5);
            } else {
                unallocated_encoding(s);
            }
            break;
        case 5:
        case 7:
            /* UMOV/SMOV (is_q indicates 32/64; imm4 indicates signedness) */
            handle_simd_umov_smov(s, is_q, (imm4 == 5), rn, rd, imm5);
            break;
        default:
            unallocated_encoding(s);
            break;
        }
    }
}